

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O2

void __thiscall
USBAnalyzerResults::GenerateExportFileSignals
          (USBAnalyzerResults *this,char *file,DisplayBase display_base)

{
  long lVar1;
  undefined8 uVar2;
  undefined2 uVar3;
  char cVar4;
  uint uVar5;
  ulonglong uVar6;
  ostream *poVar7;
  ulonglong uVar8;
  char *pcVar9;
  U64 fcnt;
  ulonglong uVar10;
  Frame f;
  char local_2f8;
  ulonglong local_2e0;
  long lStack_2d8;
  undefined8 local_2d0;
  undefined2 local_2c0;
  char time_str [128];
  ofstream file_stream;
  
  std::ofstream::ofstream(&file_stream,file,_S_out);
  uVar6 = Analyzer::GetTriggerSample();
  uVar5 = Analyzer::GetSampleRate();
  poVar7 = std::operator<<((ostream *)&file_stream,"Time [s],Signal,Duration [ns]");
  std::endl<char,std::char_traits<char>>(poVar7);
  Frame::Frame(&f);
  time_str[0] = '\0';
  uVar8 = AnalyzerResults::GetNumFrames();
  for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    AnalyzerResults::GetFrame((ulonglong)&local_2e0);
    uVar3 = local_2c0;
    uVar2 = local_2d0;
    lVar1 = lStack_2d8;
    _f = local_2e0;
    Frame::~Frame((Frame *)&local_2e0);
    cVar4 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar10);
    if (cVar4 != '\0') goto LAB_00132319;
    AnalyzerHelpers::GetTimeString(_f,uVar6,uVar5,time_str,0x80);
    poVar7 = std::operator<<((ostream *)&file_stream,time_str);
    std::operator<<(poVar7,",");
    local_2f8 = (char)uVar3;
    if (local_2f8 != '\0') goto LAB_00132303;
    pcVar9 = "SE0";
    switch(uVar2) {
    case 0:
      cVar4 = 'K';
      goto LAB_001322c8;
    case 1:
      cVar4 = 'J';
LAB_001322c8:
      std::operator<<((ostream *)&file_stream,cVar4);
      break;
    case 3:
      pcVar9 = "SE1";
    case 2:
      std::operator<<((ostream *)&file_stream,pcVar9);
    }
    std::operator<<((ostream *)&file_stream,',');
    poVar7 = std::ostream::_M_insert<double>
                       ((double)(long)(lVar1 - _f) / ((double)uVar5 / 1000000000.0));
    std::endl<char,std::char_traits<char>>(poVar7);
LAB_00132303:
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar8);
LAB_00132319:
  Frame::~Frame(&f);
  std::ofstream::~ofstream(&file_stream);
  return;
}

Assistant:

void USBAnalyzerResults::GenerateExportFileSignals( const char* file, DisplayBase display_base )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    // header
    file_stream << "Time [s],Signal,Duration [ns]" << std::endl;

    Frame f;
    char time_str[ 128 ];
    time_str[ 0 ] = '\0';
    const U64 num_frames = GetNumFrames();
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        f = GetFrame( fcnt );

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;

        // make the time string
        AnalyzerHelpers::GetTimeString( f.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, sizeof( time_str ) );

        // output timestamp
        file_stream << time_str << ",";

        // start of a new packet?
        if( f.mType == FT_Signal )
        {
            if( f.mData1 == S_J )
                file_stream << 'J';
            else if( f.mData1 == S_K )
                file_stream << 'K';
            else if( f.mData1 == S_SE0 )
                file_stream << "SE0";
            else if( f.mData1 == S_SE1 )
                file_stream << "SE1";

            file_stream << ',' << ( f.mEndingSampleInclusive - f.mStartingSampleInclusive ) / ( sample_rate / 1e9 ) << std::endl;
        }
    }

    // end
    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}